

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student.h
# Opt level: O1

int __thiscall
CP::priority_queue<int,_std::less<int>_>::find_level
          (priority_queue<int,_std::less<int>_> *this,int k)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  double dVar6;
  
  uVar4 = this->mSize & 0xffffffff;
  uVar5 = (int)this->mSize - 1;
  uVar1 = 0xffffffff;
  if ((int)uVar5 < -1) {
    uVar1 = uVar5;
  }
  do {
    uVar4 = uVar4 - 1;
    uVar3 = (uint)uVar4;
    uVar5 = uVar1;
    if ((int)uVar3 < 0) break;
    uVar5 = uVar3;
  } while (this->mData[uVar3 & 0x7fffffff] != k);
  if (uVar5 == 0) {
    iVar2 = 0;
  }
  else {
    dVar6 = log2((double)(int)uVar5);
    iVar2 = (int)dVar6;
  }
  return iVar2;
}

Assistant:

int CP::priority_queue<T, C>::find_level(T k) const {
    int i = mSize - 1;
    for (; i >= 0; --i) {
        if (mData[i] == k) {
            break;
        }
    }
    return i == 0 ? i : log2(i);
}